

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint32_t __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  byte bVar1;
  uint32_t uVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  byte *pbVar5;
  pair<bool,_const_unsigned_char_*> pVar6;
  pair<bool,_const_unsigned_char_*> p;
  uint32_t tag;
  LogMessage local_e0;
  Voidify local_ce;
  uchar local_cd;
  uint local_cc;
  Nullable<const_char_*> local_c8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int buf_size;
  uint32_t first_byte_or_zero_local;
  CodedInputStream *this_local;
  bool local_a6;
  bool local_a5;
  int local_a4;
  int local_a0;
  int i;
  uint32_t result;
  uint32_t b;
  uint8_t *ptr;
  Voidify local_79;
  int local_78;
  uint local_74;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  LogMessage local_58;
  Voidify local_41;
  uint local_40;
  uchar local_39;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  uchar *local_28;
  uint local_1c;
  byte local_18;
  uint8_t *local_10;
  
  absl_log_internal_check_op_result._4_4_ = first_byte_or_zero;
  _buf_size = this;
  absl_log_internal_check_op_result._0_4_ = BufferSize(this);
  if (((int)absl_log_internal_check_op_result < 10) &&
     (((int)absl_log_internal_check_op_result < 1 || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    if (((int)absl_log_internal_check_op_result == 0) &&
       (((0 < this->buffer_size_after_limit_ || (this->total_bytes_read_ == this->current_limit_))
        && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_))))
    {
      this->legitimate_message_end_ = true;
      return 0;
    }
    uVar2 = ReadTagSlow(this);
    return uVar2;
  }
  local_cc = absl::lts_20250127::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._4_4_);
  local_cd = absl::lts_20250127::log_internal::GetReferenceableValue(*this->buffer_);
  local_c8 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_char>
                       (&local_cc,&local_cd,"first_byte_or_zero == buffer_[0]");
  if (local_c8 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_c8);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x252,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_ce,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_e0);
  }
  if (absl_log_internal_check_op_result._4_4_ == 0) {
    this->buffer_ = this->buffer_ + 1;
    return 0;
  }
  local_28 = this->buffer_;
  local_1c = absl_log_internal_check_op_result._4_4_;
  absl_log_internal_check_op_result_1 = (Nullable<const_char_*>)&p.second;
  local_39 = absl::lts_20250127::log_internal::GetReferenceableValue(*local_28);
  local_40 = absl::lts_20250127::log_internal::GetReferenceableValue(local_1c);
  local_38 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_char,unsigned_int>
                       (&local_39,&local_40,"*buffer == first_byte");
  if (local_38 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1ae,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  local_74 = absl::lts_20250127::log_internal::GetReferenceableValue(local_1c & 0x80);
  local_78 = absl::lts_20250127::log_internal::GetReferenceableValue(0x80);
  local_70 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,int>
                       (&local_74,&local_78,"first_byte & 0x80 == 0x80");
  if (local_70 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&ptr,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1af,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&ptr);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,local_1c);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ptr);
  }
  _result = local_28 + 2;
  i = (int)local_28[1];
  local_a0 = i * 0x80 + (local_1c - 0x80);
  if ((local_28[1] & 0x80) != 0) {
    bVar1 = *_result;
    i = (int)bVar1;
    local_a0 = i * 0x4000 + local_a0 + -0x4000;
    _result = local_28 + 3;
    if ((bVar1 & 0x80) != 0) {
      bVar1 = local_28[3];
      i = (int)bVar1;
      local_a0 = i * 0x200000 + local_a0 + -0x200000;
      _result = local_28 + 4;
      if ((bVar1 & 0x80) != 0) {
        _result = local_28 + 5;
        bVar1 = local_28[4];
        i = (int)bVar1;
        local_a0 = i * 0x10000000 + local_a0 + -0x10000000;
        if ((bVar1 & 0x80) != 0) {
          for (local_a4 = 0; local_a4 < 5; local_a4 = local_a4 + 1) {
            pbVar5 = _result + 1;
            bVar1 = *_result;
            i = (int)bVar1;
            _result = pbVar5;
            if ((bVar1 & 0x80) == 0) goto LAB_007eeaea;
          }
          local_a5 = false;
          pVar6 = std::make_pair<bool,unsigned_char_const*&>(&local_a5,(uchar **)&result);
          local_10 = pVar6.second;
          local_18 = pVar6.first;
          goto LAB_007eeb17;
        }
      }
    }
  }
LAB_007eeaea:
  *(int *)absl_log_internal_check_op_result_1 = local_a0;
  local_a6 = true;
  pVar6 = std::make_pair<bool,unsigned_char_const*&>(&local_a6,(uchar **)&result);
  local_10 = pVar6.second;
  local_18 = pVar6.first;
LAB_007eeb17:
  if ((local_18 & 1) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    this->buffer_ = local_10;
    this_local._4_4_ = (uint32_t)p.second;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CodedInputStream::ReadTagFallback(uint32_t first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32_t tag;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}